

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void util::str_range(string *str,int *range_begin,int *range_end)

{
  int iVar1;
  char *pcVar2;
  exception *this;
  char (*in_R8) [2];
  string local_a0;
  string local_80;
  int local_5c;
  undefined1 local_58 [4];
  int value2;
  long local_28;
  size_type idx;
  int *range_end_local;
  int *range_begin_local;
  string *str_local;
  
  idx = (size_type)range_end;
  range_end_local = range_begin;
  range_begin_local = (int *)str;
  local_28 = std::__cxx11::string::rfind((char)str,0x2d);
  if (local_28 == -1) {
    local_28 = std::__cxx11::string::rfind((char)range_begin_local,0x2c);
  }
  if (local_28 == -1) {
    *range_end_local = 0;
    iVar1 = str_value<int>((string *)range_begin_local);
    *(int *)idx = iVar1;
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)range_begin_local);
    iVar1 = str_value<int>((string *)local_58);
    *range_end_local = iVar1;
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::substr((ulong)&local_80,(ulong)range_begin_local);
    iVar1 = str_value<int>(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    local_5c = iVar1;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)range_begin_local);
    if (*pcVar2 == '-') {
      *(int *)idx = local_5c + 1;
    }
    else {
      *(int *)idx = *range_end_local + local_5c;
    }
    if (*(int *)idx <= *range_end_local) {
      this = (exception *)__cxa_allocate_exception(0x10);
      format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
                (&local_a0,(util *)"invalid range \'",(char *)range_begin_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a9ff7,in_R8
                );
      exception::exception<std::__cxx11::string>(this,&local_a0);
      __cxa_throw(this,&exception::typeinfo,exception::~exception);
    }
  }
  return;
}

Assistant:

inline void str_range(const std::string& str, int& range_begin, int& range_end)
{
    auto idx = str.rfind('-');
    if (idx == str.npos)
        idx = str.rfind(',');

    try
    {
        if (idx == str.npos)
        {
            range_begin = 0;
            range_end = str_value<int>(str);
            return;
        }

        range_begin = str_value<int>(str.substr(0, idx));
        auto value2 = str_value<int>(str.substr(idx + 1));

        if (str[idx] == '-')
            range_end = value2 + 1;
        else
            range_end = range_begin + value2;

        if (range_end > range_begin)
            return;
    }
    catch (...)
    {
    }

    throw util::exception(util::format("invalid range '", str, "'"));
}